

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

int biseq(bstring b0,bstring b1)

{
  int iVar1;
  bstring b1_local;
  bstring b0_local;
  
  if (((((b0 == (bstring)0x0) || (b1 == (bstring)0x0)) || (b0->data == (uchar *)0x0)) ||
      ((b1->data == (uchar *)0x0 || (b0->slen < 0)))) || (b1->slen < 0)) {
    b0_local._4_4_ = 0xffffffff;
  }
  else if (b0->slen == b1->slen) {
    if ((b0->data == b1->data) || (b0->slen == 0)) {
      b0_local._4_4_ = 1;
    }
    else {
      iVar1 = memcmp(b0->data,b1->data,(long)b0->slen);
      b0_local._4_4_ = (uint)((iVar1 != 0 ^ 0xffU) & 1);
    }
  }
  else {
    b0_local._4_4_ = 0;
  }
  return b0_local._4_4_;
}

Assistant:

int biseq (const bstring b0, const bstring b1) {
	if (b0 == NULL || b1 == NULL || b0->data == NULL || b1->data == NULL ||
		b0->slen < 0 || b1->slen < 0) return BSTR_ERR;
	if (b0->slen != b1->slen) return 0;
	if (b0->data == b1->data || b0->slen == 0) return 1;
	return !memcmp (b0->data, b1->data, b0->slen);
}